

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_name.c
# Opt level: O0

int do_naming(obj *obj)

{
  char *pcVar1;
  nh_menuitem *pnVar2;
  bool bVar3;
  char *local_110;
  nh_menuitem *_item__5;
  nh_menuitem *_item__4;
  nh_menuitem *_item__3;
  nh_menuitem *_item__2;
  nh_menuitem *_item__1;
  nh_menuitem *_item_;
  char *otypname;
  char title [128];
  undefined1 local_30 [8];
  menulist menu;
  int selected [1];
  int n;
  obj *obj_local;
  
  init_menulist((menulist *)local_30);
  if (obj == (obj *)0x0) {
    snprintf((char *)&otypname,0x80,"What do you wish to name?");
    if ((int)menu.items <= menu.items._4_4_) {
      menu.items._0_4_ = (int)menu.items << 1;
      local_30 = (undefined1  [8])realloc((void *)local_30,(long)(int)menu.items * 0x10c);
    }
    pnVar2 = (nh_menuitem *)((long)local_30 + (long)menu.items._4_4_ * 0x10c);
    pnVar2->id = 1;
    pnVar2->role = MI_NORMAL;
    pnVar2->accel = 'C';
    pnVar2->group_accel = '\0';
    pnVar2->selected = '\0';
    strcpy(pnVar2->caption,"Name a monster");
    menu.items._4_4_ = menu.items._4_4_ + 1;
    if ((int)menu.items <= menu.items._4_4_) {
      menu.items._0_4_ = (int)menu.items << 1;
      local_30 = (undefined1  [8])realloc((void *)local_30,(long)(int)menu.items * 0x10c);
    }
    pnVar2 = (nh_menuitem *)((long)local_30 + (long)menu.items._4_4_ * 0x10c);
    pnVar2->id = 2;
    pnVar2->role = MI_NORMAL;
    pnVar2->accel = 'y';
    pnVar2->group_accel = '\0';
    pnVar2->selected = '\0';
    strcpy(pnVar2->caption,"Name an individual item");
    menu.items._4_4_ = menu.items._4_4_ + 1;
    if ((int)menu.items <= menu.items._4_4_) {
      menu.items._0_4_ = (int)menu.items << 1;
      local_30 = (undefined1  [8])realloc((void *)local_30,(long)(int)menu.items * 0x10c);
    }
    pnVar2 = (nh_menuitem *)((long)local_30 + (long)menu.items._4_4_ * 0x10c);
    pnVar2->id = 3;
    pnVar2->role = MI_NORMAL;
    pnVar2->accel = 'n';
    pnVar2->group_accel = '\0';
    pnVar2->selected = '\0';
    strcpy(pnVar2->caption,"Name all items of a certain type");
    menu.items._4_4_ = menu.items._4_4_ + 1;
    if ((int)menu.items <= menu.items._4_4_) {
      menu.items._0_4_ = (int)menu.items << 1;
      local_30 = (undefined1  [8])realloc((void *)local_30,(long)(int)menu.items * 0x10c);
    }
    pnVar2 = (nh_menuitem *)((long)local_30 + (long)menu.items._4_4_ * 0x10c);
    pnVar2->id = 4;
    pnVar2->role = MI_NORMAL;
    pnVar2->accel = 'f';
    pnVar2->group_accel = '\0';
    pnVar2->selected = '\0';
    strcpy(pnVar2->caption,"Annotate this level");
  }
  else {
    local_110 = simple_typename((int)obj->otyp);
    bVar3 = true;
    if (obj->quan < 2) {
      bVar3 = obj->oartifact == '\x1d';
    }
    pcVar1 = "";
    if (bVar3) {
      pcVar1 = "stack of ";
    }
    if ((1 < obj->quan) || (obj->oartifact == '\x1d')) {
      local_110 = makeplural(local_110);
    }
    snprintf((char *)&otypname,0x80,"Name this individual %s%s?",pcVar1,local_110);
    if ((int)menu.items <= menu.items._4_4_) {
      menu.items._0_4_ = (int)menu.items << 1;
      local_30 = (undefined1  [8])realloc((void *)local_30,(long)(int)menu.items * 0x10c);
    }
    pnVar2 = (nh_menuitem *)((long)local_30 + (long)menu.items._4_4_ * 0x10c);
    pnVar2->id = 2;
    pnVar2->role = MI_NORMAL;
    pnVar2->accel = 'y';
    pnVar2->group_accel = '\0';
    pnVar2->selected = '\0';
    bVar3 = true;
    if (obj->quan < 2) {
      bVar3 = obj->oartifact == '\x1d';
    }
    pcVar1 = "Yes, just this item";
    if (bVar3) {
      pcVar1 = "Yes, just this stack";
    }
    strcpy(pnVar2->caption,pcVar1);
    menu.items._4_4_ = menu.items._4_4_ + 1;
    if ((int)menu.items <= menu.items._4_4_) {
      menu.items._0_4_ = (int)menu.items << 1;
      local_30 = (undefined1  [8])realloc((void *)local_30,(long)(int)menu.items * 0x10c);
    }
    pnVar2 = (nh_menuitem *)((long)local_30 + (long)menu.items._4_4_ * 0x10c);
    pnVar2->id = 3;
    pnVar2->role = MI_NORMAL;
    pnVar2->accel = 'n';
    pnVar2->group_accel = '\0';
    pnVar2->selected = '\0';
    strcpy(pnVar2->caption,"No, call all items of this type");
  }
  menu.items._4_4_ = menu.items._4_4_ + 1;
  if ((obj == (obj *)0x0) ||
     (pcVar1 = strchr("\t\b\v\x04\x05\r\n\x03\x06",(int)obj->oclass), pcVar1 != (char *)0x0)) {
    menu.icount = display_menu((nh_menuitem *)local_30,menu.items._4_4_,(char *)&otypname,1,
                               &menu.size);
  }
  else {
    menu.icount = 1;
    menu.size = 2;
  }
  free((void *)local_30);
  if (menu.icount != 0) {
    menu.icount = menu.size + -1;
    switch(menu.icount) {
    case 0:
      do_mname();
      break;
    case 1:
      do_oname(obj);
      break;
    case 2:
      do_tname(obj);
      break;
    case 3:
      donamelevel();
    }
  }
  return 0;
}

Assistant:

int do_naming(struct obj *obj)
{
	int n, selected[1];
	struct menulist menu;
	char title[QBUFSZ];

	init_menulist(&menu);

	if (obj) {
	    char *otypname = simple_typename(obj->otyp);
	    snprintf(title, QBUFSZ, "Name this individual %s%s?",
		     is_plural(obj) ? "stack of " : "",
		     is_plural(obj) ? makeplural(otypname) : otypname);
	    add_menuitem(&menu, 2, is_plural(obj) ? "Yes, just this stack" :
						    "Yes, just this item",
			 'y', FALSE);
	    add_menuitem(&menu, 3, "No, call all items of this type", 'n', FALSE);
	} else {
	    snprintf(title, QBUFSZ, "What do you wish to name?");
	    add_menuitem(&menu, 1, "Name a monster", 'C', FALSE);
	    add_menuitem(&menu, 2, "Name an individual item", 'y', FALSE);
	    add_menuitem(&menu, 3, "Name all items of a certain type", 'n', FALSE);
	    add_menuitem(&menu, 4, "Annotate this level", 'f', FALSE);
	}

	if (!obj || strchr(callable, obj->oclass)) {
	    n = display_menu(menu.items, menu.icount, title, PICK_ONE, selected);
	} else {
	    /* simulate choice to name individual item automatically */
	    n = 1;
	    selected[0] = 2;	/* name one */
	}

	free(menu.items);
	if (n)
	    n = selected[0] - 1;
	else
	    return 0;

	switch (n) {
	    default: break;
	    case 0:
		do_mname();
		break;
	    case 1:
		do_oname(obj);
		break;
	    case 2:
		do_tname(obj);
		break;
	    case 3:
		donamelevel();
		break;
	}
	return 0;
}